

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::Tsub<double>(VM *this)

{
  double_t dVar1;
  double_t dVar2;
  double_t lhs;
  double_t rhs;
  VM *this_local;
  
  dVar1 = POP<double>(this);
  dVar2 = POP<double>(this);
  PUSH<double>(this,dVar2 - dVar1);
  return;
}

Assistant:

void VM::Tsub() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    PUSH(lhs-rhs);
}